

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkers.cpp
# Opt level: O0

Am_Wrapper * find_feedback_proc(Am_Object *self)

{
  byte bVar1;
  Am_Value *pAVar2;
  Am_Object local_40 [3];
  Am_Object local_28;
  Am_Object local_20;
  Am_Object window;
  Am_Object *self_local;
  
  window.data = (Am_Object_Data *)self;
  Am_Object::Am_Object(&local_20);
  Am_Object::Get_Owner(&local_28,(Am_Slot_Flags)window.data);
  pAVar2 = (Am_Value *)Am_Object::Get((ushort)&local_28,0x68);
  Am_Object::operator=(&local_20,pAVar2);
  Am_Object::~Am_Object(&local_28);
  bVar1 = Am_Object::Valid();
  if ((bVar1 & 1) == 0) {
    self_local = (Am_Object *)0x0;
  }
  else {
    Am_Object::Get_Object((ushort)local_40,(ulong)&local_20);
    self_local = (Am_Object *)Am_Object::operator_cast_to_Am_Wrapper_(local_40);
    Am_Object::~Am_Object(local_40);
  }
  Am_Object::~Am_Object(&local_20);
  return (Am_Wrapper *)self_local;
}

Assistant:

Am_Define_Object_Formula(find_feedback)
{
  Am_Object window;
  window = self.Get_Owner().Get(Am_WINDOW);
  if (window.Valid())
    return window.Get_Object(FEEDBACK);
  else
    return nullptr;
}